

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_search.c
# Opt level: O2

ps_lattice_t * fsg_search_lattice(ps_search_t *search)

{
  uint *puVar1;
  float fVar2;
  fsg_model_t *fsg;
  undefined8 *puVar3;
  void *ptr;
  logmath_t *plVar4;
  int32 iVar5;
  int iVar6;
  s3wid_t sVar7;
  ps_lattice_t *ppVar8;
  fsg_hist_entry_t *pfVar9;
  fsg_hist_entry_t *pfVar10;
  ps_latnode_t *ppVar11;
  fsg_arciter_t *itor;
  fsg_link_t *pfVar12;
  ps_latnode_t *ppVar13;
  fsg_arciter_t *itor_00;
  glist_t pgVar14;
  ps_latnode_t **pppVar15;
  gnode_t *gn;
  int32 iVar16;
  long lVar17;
  gnode_s *pgVar18;
  long *plVar19;
  uint uVar20;
  int iVar21;
  ulong in_R8;
  char *pcVar22;
  int32 node_id;
  char *pcVar23;
  int32 iVar24;
  ps_latnode_t **pppVar25;
  double dVar26;
  int32 in_stack_ffffffffffffffa8;
  
  ppVar8 = search->dag;
  if ((ppVar8 == (ps_lattice_t *)0x0) || (ppVar8->n_frames != search[1].post)) {
    ps_lattice_free(ppVar8);
    search->dag = (ps_lattice_t *)0x0;
    ppVar8 = ps_lattice_init_search(search,search[1].post);
    fsg = (fsg_model_t *)search[1].type;
    iVar5 = fsg_history_n_entries((fsg_history_t *)search[1].pls);
    iVar24 = 0;
    if (iVar5 < 1) {
      iVar5 = iVar24;
    }
    for (; iVar5 != iVar24; iVar24 = iVar24 + 1) {
      pfVar9 = fsg_history_entry_get((fsg_history_t *)search[1].pls,iVar24);
      pfVar12 = pfVar9->fsglink;
      if ((pfVar12 != (fsg_link_t *)0x0) && (iVar16 = pfVar12->wid, iVar16 != -1)) {
        if (pfVar9->pred == 0) {
          node_id = pfVar9->score;
          uVar20 = 0;
        }
        else {
          pfVar10 = fsg_history_entry_get((fsg_history_t *)search[1].pls,pfVar9->pred);
          node_id = pfVar9->score - pfVar10->score;
          uVar20 = pfVar10->frame + 1;
          pfVar12 = pfVar9->fsglink;
          iVar16 = pfVar12->wid;
        }
        in_R8 = (ulong)(uint)pfVar12->to_state;
        new_node(ppVar8,(fsg_model_t *)(ulong)uVar20,pfVar9->frame,iVar16,pfVar12->to_state,node_id,
                 in_stack_ffffffffffffffa8);
      }
    }
    iVar6 = fsg_history_n_entries((fsg_history_t *)search[1].pls);
    iVar21 = 0;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    for (; iVar21 != iVar6; iVar21 = iVar21 + 1) {
      pfVar9 = fsg_history_entry_get((fsg_history_t *)search[1].pls,iVar21);
      pfVar12 = pfVar9->fsglink;
      if ((pfVar12 != (fsg_link_t *)0x0) && (iVar5 = pfVar12->wid, iVar5 != -1)) {
        if (pfVar9->pred == 0) {
          iVar24 = pfVar9->score;
          uVar20 = 0;
        }
        else {
          pfVar10 = fsg_history_entry_get((fsg_history_t *)search[1].pls,pfVar9->pred);
          uVar20 = pfVar10->frame + 1;
          iVar24 = pfVar9->score - pfVar10->score;
          pfVar12 = pfVar9->fsglink;
          iVar5 = pfVar12->wid;
        }
        iVar16 = pfVar12->to_state;
        ppVar11 = find_node(ppVar8,(fsg_model_t *)(ulong)uVar20,iVar5,iVar16,(int32)in_R8);
        uVar20 = pfVar9->frame + 1;
        for (itor = fsg_model_arcs(fsg,iVar16); itor != (fsg_arciter_t *)0x0;
            itor = fsg_arciter_next(itor)) {
          pfVar12 = fsg_arciter_get(itor);
          if (pfVar12->wid < 0) {
            for (itor_00 = fsg_model_arcs(fsg,pfVar12->to_state); itor_00 != (fsg_arciter_t *)0x0;
                itor_00 = fsg_arciter_next(itor_00)) {
              pfVar12 = fsg_arciter_get(itor_00);
              if ((pfVar12->wid != -1) &&
                 (ppVar13 = find_node(ppVar8,(fsg_model_t *)(ulong)uVar20,pfVar12->wid,
                                      pfVar12->to_state,(int32)in_R8),
                 ppVar13 != (ps_latnode_t *)0x0)) {
                in_R8 = (ulong)(uint)pfVar9->frame;
                ps_lattice_link(ppVar8,ppVar11,ppVar13,iVar24,pfVar9->frame);
              }
            }
          }
          else {
            ppVar13 = find_node(ppVar8,(fsg_model_t *)(ulong)uVar20,pfVar12->wid,pfVar12->to_state,
                                (int32)in_R8);
            if (ppVar13 != (ps_latnode_t *)0x0) {
              in_R8 = (ulong)(uint)pfVar9->frame;
              ps_lattice_link(ppVar8,ppVar11,ppVar13,iVar24,pfVar9->frame);
            }
          }
        }
      }
    }
    pgVar14 = (glist_t)0x0;
    iVar6 = 0;
    pppVar25 = &ppVar8->nodes;
    pppVar15 = pppVar25;
    while (ppVar11 = *pppVar15, ppVar11 != (ps_latnode_t *)0x0) {
      if ((ppVar11->sf == 0) && (ppVar11->exits != (latlink_list_t *)0x0)) {
        pcVar22 = "(NULL)";
        if ((long)ppVar11->wid != -1) {
          pcVar22 = *(char **)(*(long *)(search[1].type + 0x18) + (long)ppVar11->wid * 8);
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                ,0x4f3,"Start node candidate %s.%d:%d:%d\n",pcVar22,0,(ulong)(uint)ppVar11->fef,
                (ulong)(uint)ppVar11->lef);
        pgVar14 = glist_add_ptr(pgVar14,ppVar11);
        iVar6 = iVar6 + 1;
      }
      pppVar15 = &ppVar11->next;
    }
    if (iVar6 == 1) {
      ppVar11 = (ps_latnode_t *)(pgVar14->data).ptr;
    }
    else {
      iVar6 = fsg_model_word_add((fsg_model_t *)search[1].type,"<s>");
      if (*(long *)(search[1].type + 0x20) != 0) {
        puVar1 = (uint *)(*(long *)(search[1].type + 0x20) + (long)(iVar6 / 0x20) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)iVar6 & 0x1f);
      }
      ppVar11 = new_node(ppVar8,(fsg_model_t *)0x0,0,iVar6,-1,0,in_stack_ffffffffffffffa8);
      for (pgVar18 = pgVar14; pgVar18 != (glist_t)0x0; pgVar18 = pgVar18->next) {
        ps_lattice_link(ppVar8,ppVar11,(ps_latnode_t *)(pgVar18->data).ptr,0,0);
      }
    }
    glist_free(pgVar14);
    ppVar8->start = ppVar11;
    if (ppVar11 == (ps_latnode_t *)0x0) {
      pcVar22 = "Failed to find the start node\n";
      lVar17 = 0x5f0;
    }
    else {
      iVar6 = 0;
      pgVar14 = (glist_t)0x0;
      pppVar15 = pppVar25;
      while (ppVar11 = *pppVar15, ppVar11 != (ps_latnode_t *)0x0) {
        if ((ppVar11->lef == ppVar8->n_frames - 1U) && (ppVar11->entries != (latlink_list_t *)0x0))
        {
          pcVar22 = "(NULL)";
          if ((long)ppVar11->wid != -1) {
            pcVar22 = *(char **)(*(long *)(search[1].type + 0x18) + (long)ppVar11->wid * 8);
          }
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                  ,0x51a,"End node candidate %s.%d:%d:%d (%d)\n",pcVar22,(ulong)(uint)ppVar11->sf,
                  (ulong)(uint)ppVar11->fef,(ulong)(uint)ppVar11->lef,
                  (ulong)(uint)(ppVar11->info).fanin);
          pgVar14 = glist_add_ptr(pgVar14,ppVar11);
          iVar6 = iVar6 + 1;
        }
        pppVar15 = &ppVar11->next;
      }
      if (iVar6 == 1) {
        ppVar11 = (ps_latnode_t *)(pgVar14->data).i;
      }
      else if (iVar6 == 0) {
        ppVar11 = (ps_latnode_t *)0x0;
        iVar6 = 0;
        pppVar15 = pppVar25;
        while (ppVar13 = *pppVar15, ppVar13 != (ps_latnode_t *)0x0) {
          if ((iVar6 < ppVar13->lef) && (ppVar13->entries != (latlink_list_t *)0x0)) {
            ppVar11 = ppVar13;
            iVar6 = ppVar13->lef;
          }
          pppVar15 = &ppVar13->next;
        }
        if (ppVar11 == (ps_latnode_t *)0x0) {
          ppVar11 = (ps_latnode_t *)0x0;
        }
        else {
          if ((long)ppVar11->wid == -1) {
            pcVar22 = "(NULL)";
          }
          else {
            pcVar22 = *(char **)(*(long *)(search[1].type + 0x18) + (long)ppVar11->wid * 8);
          }
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                  ,0x533,"End node %s.%d:%d:%d (%d)\n",pcVar22,(ulong)(uint)ppVar11->sf,
                  (ulong)(uint)ppVar11->fef,(ulong)(uint)ppVar11->lef,
                  (ulong)(uint)(ppVar11->info).fanin);
        }
      }
      else {
        iVar6 = fsg_model_word_add((fsg_model_t *)search[1].type,"</s>");
        if (*(long *)(search[1].type + 0x20) != 0) {
          puVar1 = (uint *)(*(long *)(search[1].type + 0x20) + (long)(iVar6 / 0x20) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)iVar6 & 0x1f);
        }
        ppVar11 = new_node(ppVar8,(fsg_model_t *)(ulong)(uint)search[1].post,search[1].post,iVar6,-1
                           ,0,in_stack_ffffffffffffffa8);
        for (pgVar18 = pgVar14; pgVar18 != (glist_t)0x0; pgVar18 = pgVar18->next) {
          ps_lattice_link(ppVar8,(ps_latnode_t *)(pgVar18->data).ptr,ppVar11,
                          (((ps_latnode_t *)(pgVar18->data).ptr)->info).fanin,search[1].post);
        }
      }
      glist_free(pgVar14);
      ppVar8->end = ppVar11;
      if (ppVar11 != (ps_latnode_t *)0x0) {
        lVar17 = (long)ppVar8->start->wid;
        pcVar22 = "(NULL)";
        if (lVar17 != -1) {
          pcVar22 = fsg->vocab[lVar17];
        }
        pcVar23 = "(NULL)";
        if ((long)ppVar11->wid != -1) {
          pcVar23 = fsg->vocab[ppVar11->wid];
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                ,0x5fb,"lattice start node %s.%d end node %s.%d\n",pcVar22,
                (ulong)(uint)ppVar8->start->sf,pcVar23,(ulong)(uint)ppVar11->sf);
        while (ppVar11 = *pppVar25, ppVar11 != (ps_latnode_t *)0x0) {
          pcVar22 = "(NULL)";
          if ((long)ppVar11->wid != -1) {
            pcVar22 = fsg->vocab[ppVar11->wid];
          }
          sVar7 = dict_wordid(ppVar8->search->dict,pcVar22);
          ppVar11->wid = sVar7;
          ppVar11->basewid = ppVar8->search->dict->word[sVar7].basewid;
          pppVar25 = &ppVar11->next;
        }
        ppVar11 = ppVar8->end;
        ppVar11->reachable = 1;
        gn = glist_add_ptr((glist_t)0x0,ppVar11);
        while (gn != (gnode_t *)0x0) {
          lVar17 = (gn->data).i;
          gn = gnode_free(gn,(gnode_t *)0x0);
          plVar19 = (long *)(lVar17 + 0x30);
          while (puVar3 = (undefined8 *)*plVar19, puVar3 != (undefined8 *)0x0) {
            ptr = *(void **)*puVar3;
            if (*(short *)((long)ptr + 0x18) == 0) {
              *(undefined2 *)((long)ptr + 0x18) = 1;
              gn = glist_add_ptr(gn,ptr);
            }
            plVar19 = puVar3 + 1;
          }
        }
        ps_lattice_delete_unreachable(ppVar8);
        plVar4 = fsg->lmath;
        dVar26 = ps_config_float(search->config,"silprob");
        iVar6 = logmath_log(plVar4,(float64)dVar26);
        fVar2 = (float)fsg->lw;
        plVar4 = fsg->lmath;
        dVar26 = ps_config_float(search->config,"fillprob");
        iVar21 = logmath_log(plVar4,(float64)dVar26);
        ps_lattice_penalize_fillers
                  (ppVar8,(int)((float)iVar6 * fVar2) >> 10,
                   (int)((float)iVar21 * (float)fsg->lw) >> 10);
        search->dag = ppVar8;
        return ppVar8;
      }
      pcVar22 = "Failed to find the end node\n";
      lVar17 = 0x5f4;
    }
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
            ,lVar17,pcVar22);
    ps_lattice_free(ppVar8);
    ppVar8 = (ps_lattice_t *)0x0;
  }
  return ppVar8;
}

Assistant:

static ps_lattice_t *
fsg_search_lattice(ps_search_t *search)
{
    fsg_search_t *fsgs;
    fsg_model_t *fsg;
    ps_latnode_t *node;
    ps_lattice_t *dag;
    int32 i, n;

    fsgs = (fsg_search_t *)search;

    /* Check to see if a lattice has previously been created over the
     * same number of frames, and reuse it if so. */
    if (search->dag && search->dag->n_frames == fsgs->frame)
        return search->dag;

    /* Nope, create a new one. */
    ps_lattice_free(search->dag);
    search->dag = NULL;
    dag = ps_lattice_init_search(search, fsgs->frame);
    fsg = fsgs->fsg;

    /*
     * Each history table entry represents a link in the word graph.
     * The set of nodes is determined by the number of unique
     * (word,start-frame) pairs in the history table.  So we will
     * first find all those nodes.
     */
    n = fsg_history_n_entries(fsgs->history);
    for (i = 0; i < n; ++i) {
        fsg_hist_entry_t *fh = fsg_history_entry_get(fsgs->history, i);
        int32 ascr;
        int sf;

        /* Skip null transitions. */
        if (fh->fsglink == NULL || fh->fsglink->wid == -1)
            continue;

        /* Find the start node of this link. */
        if (fh->pred) {
            fsg_hist_entry_t *pfh = fsg_history_entry_get(fsgs->history, fh->pred);
            /* FIXME: We include the transition score in the lattice
             * link score.  This is because of the practical
             * difficulty of obtaining it separately in bestpath or
             * forward-backward search, and because it is essentially
             * a unigram probability, so there is no need to treat it
             * separately from the acoustic score.  However, it's not
             * clear that this will actually yield correct results.*/
            ascr = fh->score - pfh->score;
            sf = pfh->frame + 1;
        }
        else {
            ascr = fh->score;
            sf = 0;
        }

        /*
         * Note that although scores are tied to links rather than
         * nodes, it's possible that there are no links out of the
         * destination node, and thus we need to preserve its score in
         * case it turns out to be utterance-final.
         */
        new_node(dag, fsg, sf, fh->frame, fh->fsglink->wid, fsg_link_to_state(fh->fsglink), ascr);
    }

    /*
     * Now, we will create links only to nodes that actually exist.
     */
    n = fsg_history_n_entries(fsgs->history);
    for (i = 0; i < n; ++i) {
        fsg_hist_entry_t *fh = fsg_history_entry_get(fsgs->history, i);
        fsg_arciter_t *itor;
        ps_latnode_t *src, *dest;
        int32 ascr;
        int sf;

        /* Skip null transitions. */
        if (fh->fsglink == NULL || fh->fsglink->wid == -1)
            continue;

        /* Find the start node of this link and calculate its link score. */
        if (fh->pred) {
            fsg_hist_entry_t *pfh = fsg_history_entry_get(fsgs->history, fh->pred);
            sf = pfh->frame + 1;
            ascr = fh->score - pfh->score;
        }
        else {
            ascr = fh->score;
            sf = 0;
        }
        src = find_node(dag, fsg, sf, fh->fsglink->wid, fsg_link_to_state(fh->fsglink));
        sf = fh->frame + 1;

        for (itor = fsg_model_arcs(fsg, fsg_link_to_state(fh->fsglink));
             itor; itor = fsg_arciter_next(itor)) {
            fsg_link_t *link = fsg_arciter_get(itor);
            
            /* FIXME: Need to figure out what to do about tag transitions. */
            if (link->wid >= 0) {
                /*
                 * For each non-epsilon link following this one, look for a
                 * matching node in the lattice and link to it.
                 */
                if ((dest = find_node(dag, fsg, sf, link->wid, fsg_link_to_state(link))) != NULL)
            	    ps_lattice_link(dag, src, dest, ascr, fh->frame);
            }
            else {
                /*
                 * Transitive closure on nulls has already been done, so we
                 * just need to look one link forward from them.
                 */
                fsg_arciter_t *itor2;
                
                /* Add all non-null links out of j. */
                for (itor2 = fsg_model_arcs(fsg, fsg_link_to_state(link));
                     itor2; itor2 = fsg_arciter_next(itor2)) {
                    fsg_link_t *link = fsg_arciter_get(itor2);

                    if (link->wid == -1)
                        continue;
                    
                    if ((dest = find_node(dag, fsg, sf, link->wid, fsg_link_to_state(link))) != NULL) {
                        ps_lattice_link(dag, src, dest, ascr, fh->frame);
                    }
                }
            }
        }
    }


    /* Figure out which nodes are the start and end nodes. */
    if ((dag->start = find_start_node(fsgs, dag)) == NULL) {
	E_WARN("Failed to find the start node\n");
        goto error_out;
    }
    if ((dag->end = find_end_node(fsgs, dag)) == NULL) {
	E_WARN("Failed to find the end node\n");
        goto error_out;
    }


    E_INFO("lattice start node %s.%d end node %s.%d\n",
           fsg_model_word_str(fsg, dag->start->wid), dag->start->sf,
           fsg_model_word_str(fsg, dag->end->wid), dag->end->sf);
    /* FIXME: Need to calculate final_node_ascr here. */

    /*
     * Convert word IDs from FSG to dictionary.
     */
    for (node = dag->nodes; node; node = node->next) {
        node->wid = dict_wordid(dag->search->dict,
                                fsg_model_word_str(fsg, node->wid));
        node->basewid = dict_basewid(dag->search->dict, node->wid);
    }

    /*
     * Now we are done, because the links in the graph are uniquely
     * defined by the history table.  However we should remove any
     * nodes which are not reachable from the end node of the FSG.
     * Everything is reachable from the start node by definition.
     */
    mark_reachable(dag, dag->end);

    ps_lattice_delete_unreachable(dag);
    {
        int32 silpen, fillpen;

        silpen = (int32)(logmath_log(fsg->lmath,
                                     ps_config_float(ps_search_config(fsgs), "silprob"))
                         * fsg->lw)
            >> SENSCR_SHIFT;
        fillpen = (int32)(logmath_log(fsg->lmath,
                                      ps_config_float(ps_search_config(fsgs), "fillprob"))
                          * fsg->lw)
            >> SENSCR_SHIFT;
	
	ps_lattice_penalize_fillers(dag, silpen, fillpen);
    }
    search->dag = dag;

    return dag;


error_out:
    ps_lattice_free(dag);
    return NULL;

}